

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O2

REF_STATUS
ref_grid_node_list_around
          (REF_GRID ref_grid,REF_INT node,REF_INT max_node,REF_INT *nnode,REF_INT *node_list)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  REF_CELL pRVar4;
  REF_ADJ pRVar5;
  REF_ADJ_ITEM pRVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  REF_CELL *ppRVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  REF_INT RVar14;
  
  *nnode = 0;
  ppRVar10 = ref_grid->cell + 3;
  lVar8 = 3;
  uVar9 = 0;
  do {
    if (lVar8 == 0x10) {
      return 0;
    }
    pRVar4 = *ppRVar10;
    uVar13 = 0xffffffff;
    RVar14 = -1;
    if (-1 < node) {
      pRVar5 = pRVar4->ref_adj;
      uVar13 = 0xffffffff;
      RVar14 = -1;
      if (node < pRVar5->nnode) {
        uVar2 = pRVar5->first[(uint)node];
        uVar13 = 0xffffffff;
        RVar14 = -1;
        if ((long)(int)uVar2 != -1) {
          RVar14 = pRVar5->item[(int)uVar2].ref;
          uVar13 = (ulong)uVar2;
        }
      }
    }
    while ((int)uVar13 != -1) {
      for (iVar12 = 0; iVar12 < pRVar4->node_per; iVar12 = iVar12 + 1) {
        iVar3 = pRVar4->c2n[pRVar4->size_per * RVar14 + iVar12];
        if (iVar3 != node) {
          uVar7 = 0;
          if (0 < (int)uVar9) {
            uVar7 = (ulong)uVar9;
          }
          uVar11 = 0;
          do {
            if (uVar7 == uVar11) {
              if (max_node <= (int)uVar9) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                       ,0x35f,"ref_grid_node_list_around",7,"max_node too small");
                return 7;
              }
              node_list[(int)uVar9] = iVar3;
              uVar9 = *nnode + 1;
              *nnode = uVar9;
              break;
            }
            piVar1 = node_list + uVar11;
            uVar11 = uVar11 + 1;
          } while (*piVar1 != iVar3);
        }
      }
      pRVar6 = pRVar4->ref_adj->item;
      uVar13 = (ulong)pRVar6[(int)uVar13].next;
      RVar14 = -1;
      if (uVar13 != 0xffffffffffffffff) {
        RVar14 = pRVar6[uVar13].ref;
      }
    }
    ppRVar10 = ref_grid->cell + lVar8 + 1;
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_grid_node_list_around(REF_GRID ref_grid, REF_INT node,
                                             REF_INT max_node, REF_INT *nnode,
                                             REF_INT *node_list) {
  REF_INT cell, item, cell_node, haves, group;
  REF_CELL ref_cell;
  REF_BOOL already_have_it;

  *nnode = 0;
  each_ref_grid_2d_3d_ref_cell(ref_grid, group, ref_cell) {
    each_ref_cell_having_node(ref_cell, node, item, cell) {
      for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell);
           cell_node++) {
        if (node == ref_cell_c2n(ref_cell, cell_node, cell)) continue;
        already_have_it = REF_FALSE;
        for (haves = 0; haves < *nnode; haves++)
          if (node_list[haves] == ref_cell_c2n(ref_cell, cell_node, cell)) {
            already_have_it = REF_TRUE;
            break;
          }
        if (!already_have_it) {
          if (*nnode >= max_node) {
            RSS(REF_INCREASE_LIMIT, "max_node too small");
          }
          node_list[*nnode] = ref_cell_c2n(ref_cell, cell_node, cell);
          (*nnode)++;
        }
      }
    }
  }

  return REF_SUCCESS;
}